

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void av1_idct8_sse2(__m128i *input,__m128i *output)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined8 uVar63;
  undefined8 uVar64;
  int iVar65;
  uint uVar66;
  int iVar67;
  uint uVar68;
  undefined4 uVar69;
  int iVar70;
  int iVar71;
  uint uVar72;
  uint uVar73;
  int32_t *piVar74;
  undefined1 (*in_RSI) [16];
  undefined8 *in_RDI;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  __m128i _in1_7;
  __m128i _in0_7;
  __m128i _in1_6;
  __m128i _in0_6;
  __m128i _in1_5;
  __m128i _in0_5;
  __m128i _in1_4;
  __m128i _in0_4;
  __m128i d1_4;
  __m128i d0_4;
  __m128i c1_4;
  __m128i c0_4;
  __m128i b1_4;
  __m128i b0_4;
  __m128i a1_4;
  __m128i a0_4;
  __m128i v1_4;
  __m128i v0_4;
  __m128i u1_4;
  __m128i u0_4;
  __m128i t1_4;
  __m128i t0_4;
  __m128i _in1_3;
  __m128i _in0_3;
  __m128i _in1_2;
  __m128i _in0_2;
  __m128i _in1_1;
  __m128i _in0_1;
  __m128i _in1;
  __m128i _in0;
  __m128i d1_3;
  __m128i d0_3;
  __m128i c1_3;
  __m128i c0_3;
  __m128i b1_3;
  __m128i b0_3;
  __m128i a1_3;
  __m128i a0_3;
  __m128i v1_3;
  __m128i v0_3;
  __m128i u1_3;
  __m128i u0_3;
  __m128i t1_3;
  __m128i t0_3;
  __m128i d1_2;
  __m128i d0_2;
  __m128i c1_2;
  __m128i c0_2;
  __m128i b1_2;
  __m128i b0_2;
  __m128i a1_2;
  __m128i a0_2;
  __m128i v1_2;
  __m128i v0_2;
  __m128i u1_2;
  __m128i u0_2;
  __m128i t1_2;
  __m128i t0_2;
  __m128i d1_1;
  __m128i d0_1;
  __m128i c1_1;
  __m128i c0_1;
  __m128i b1_1;
  __m128i b0_1;
  __m128i a1_1;
  __m128i a0_1;
  __m128i v1_1;
  __m128i v0_1;
  __m128i u1_1;
  __m128i u0_1;
  __m128i t1_1;
  __m128i t0_1;
  __m128i d1;
  __m128i d0;
  __m128i c1;
  __m128i c0;
  __m128i b1;
  __m128i b0;
  __m128i a1;
  __m128i a0;
  __m128i v1;
  __m128i v0;
  __m128i u1;
  __m128i u0;
  __m128i t1;
  __m128i t0;
  __m128i x [8];
  __m128i cospi_m32_p32;
  __m128i cospi_p16_p48;
  __m128i cospi_p48_m16;
  __m128i cospi_p32_m32;
  __m128i cospi_p32_p32;
  __m128i cospi_p40_p24;
  __m128i cospi_p24_m40;
  __m128i cospi_p08_p56;
  __m128i cospi_p56_m08;
  __m128i __rounding;
  int32_t *cospi;
  int8_t cos_bit;
  undefined2 local_d48;
  undefined2 uStack_d46;
  undefined2 uStack_d44;
  undefined2 uStack_d42;
  undefined2 local_d38;
  undefined2 uStack_d36;
  undefined2 uStack_d34;
  undefined2 uStack_d32;
  undefined2 local_d28;
  undefined2 uStack_d26;
  undefined2 uStack_d24;
  undefined2 uStack_d22;
  undefined2 local_d18;
  undefined2 uStack_d16;
  undefined2 uStack_d14;
  undefined2 uStack_d12;
  undefined2 local_d08;
  undefined2 uStack_d06;
  undefined2 uStack_d04;
  undefined2 uStack_d02;
  undefined2 local_cf8;
  undefined2 uStack_cf6;
  undefined2 uStack_cf4;
  undefined2 uStack_cf2;
  undefined2 local_ce8;
  undefined2 uStack_ce6;
  undefined2 uStack_ce4;
  undefined2 uStack_ce2;
  undefined2 local_cd8;
  undefined2 uStack_cd6;
  undefined2 uStack_cd4;
  undefined2 uStack_cd2;
  undefined2 local_cc8;
  undefined2 uStack_cc6;
  undefined2 uStack_cc4;
  undefined2 uStack_cc2;
  undefined2 local_cb8;
  undefined2 uStack_cb6;
  undefined2 uStack_cb4;
  undefined2 uStack_cb2;
  undefined2 uStack_ca0;
  undefined2 uStack_c9e;
  undefined2 uStack_c9c;
  undefined2 uStack_c9a;
  undefined2 uStack_c90;
  undefined2 uStack_c8e;
  undefined2 uStack_c8c;
  undefined2 uStack_c8a;
  undefined2 uStack_c80;
  undefined2 uStack_c7e;
  undefined2 uStack_c7c;
  undefined2 uStack_c7a;
  undefined2 uStack_c70;
  undefined2 uStack_c6e;
  undefined2 uStack_c6c;
  undefined2 uStack_c6a;
  undefined2 uStack_c60;
  undefined2 uStack_c5e;
  undefined2 uStack_c5c;
  undefined2 uStack_c5a;
  undefined2 uStack_c50;
  undefined2 uStack_c4e;
  undefined2 uStack_c4c;
  undefined2 uStack_c4a;
  undefined2 uStack_c40;
  undefined2 uStack_c3e;
  undefined2 uStack_c3c;
  undefined2 uStack_c3a;
  undefined2 uStack_c30;
  undefined2 uStack_c2e;
  undefined2 uStack_c2c;
  undefined2 uStack_c2a;
  undefined2 uStack_c20;
  undefined2 uStack_c1e;
  undefined2 uStack_c1c;
  undefined2 uStack_c1a;
  undefined2 uStack_c10;
  undefined2 uStack_c0e;
  undefined2 uStack_c0c;
  undefined2 uStack_c0a;
  int local_978;
  int iStack_974;
  int iStack_970;
  int iStack_96c;
  int local_958;
  int iStack_954;
  int iStack_950;
  int iStack_94c;
  int local_938;
  int iStack_934;
  int iStack_930;
  int iStack_92c;
  int local_918;
  int iStack_914;
  int iStack_910;
  int iStack_90c;
  int local_8f8;
  int iStack_8f4;
  int iStack_8f0;
  int iStack_8ec;
  int local_8d8;
  int iStack_8d4;
  int iStack_8d0;
  int iStack_8cc;
  int local_8b8;
  int iStack_8b4;
  int iStack_8b0;
  int iStack_8ac;
  int local_898;
  int iStack_894;
  int iStack_890;
  int iStack_88c;
  int local_878;
  int iStack_874;
  int iStack_870;
  int iStack_86c;
  int local_858;
  int iStack_854;
  int iStack_850;
  int iStack_84c;
  int local_838;
  int iStack_834;
  int iStack_830;
  int iStack_82c;
  int local_818;
  int iStack_814;
  int iStack_810;
  int iStack_80c;
  int local_7f8;
  int iStack_7f4;
  int iStack_7f0;
  int iStack_7ec;
  int local_7d8;
  int iStack_7d4;
  int iStack_7d0;
  int iStack_7cc;
  int local_7b8;
  int iStack_7b4;
  int iStack_7b0;
  int iStack_7ac;
  int local_798;
  int iStack_794;
  int iStack_790;
  int iStack_78c;
  int local_778;
  int iStack_774;
  int iStack_770;
  int iStack_76c;
  int local_758;
  int iStack_754;
  int iStack_750;
  int iStack_74c;
  int local_738;
  int iStack_734;
  int iStack_730;
  int iStack_72c;
  int local_718;
  int iStack_714;
  int iStack_710;
  int iStack_70c;
  
  piVar74 = cospi_arr(0xc);
  iVar65 = (uint)*(ushort *)(piVar74 + 0x38) + piVar74[8] * -0x10000;
  uVar66 = (uint)*(ushort *)(piVar74 + 8) | piVar74[0x38] << 0x10;
  iVar67 = (uint)*(ushort *)(piVar74 + 0x18) + piVar74[0x28] * -0x10000;
  uVar68 = (uint)*(ushort *)(piVar74 + 0x28) | piVar74[0x18] << 0x10;
  uVar69 = CONCAT22((short)piVar74[0x20],(short)piVar74[0x20]);
  uVar63 = CONCAT44(uVar69,uVar69);
  uVar64 = CONCAT44(uVar69,uVar69);
  iVar70 = (piVar74[0x20] & 0xffffU) + piVar74[0x20] * -0x10000;
  iVar71 = (uint)*(ushort *)(piVar74 + 0x30) + piVar74[0x10] * -0x10000;
  uVar72 = (uint)*(ushort *)(piVar74 + 0x10) | piVar74[0x30] << 0x10;
  uVar73 = -piVar74[0x20] & 0xffffU | piVar74[0x20] << 0x10;
  uVar1 = *in_RDI;
  uVar2 = in_RDI[1];
  uVar3 = in_RDI[8];
  uVar4 = in_RDI[9];
  uVar5 = in_RDI[4];
  uVar6 = in_RDI[5];
  uVar7 = in_RDI[0xc];
  uVar8 = in_RDI[0xd];
  uVar9 = in_RDI[2];
  uVar10 = in_RDI[3];
  uVar11 = in_RDI[10];
  uVar12 = in_RDI[0xb];
  uVar13 = in_RDI[6];
  uVar14 = in_RDI[7];
  uVar15 = in_RDI[0xe];
  uVar16 = in_RDI[0xf];
  local_cb8 = (undefined2)uVar9;
  uStack_cb6 = (undefined2)((ulong)uVar9 >> 0x10);
  uStack_cb4 = (undefined2)((ulong)uVar9 >> 0x20);
  uStack_cb2 = (undefined2)((ulong)uVar9 >> 0x30);
  local_cc8 = (undefined2)uVar15;
  uStack_cc6 = (undefined2)((ulong)uVar15 >> 0x10);
  uStack_cc4 = (undefined2)((ulong)uVar15 >> 0x20);
  uStack_cc2 = (undefined2)((ulong)uVar15 >> 0x30);
  uStack_c10 = (undefined2)uVar10;
  uStack_c0e = (undefined2)((ulong)uVar10 >> 0x10);
  uStack_c0c = (undefined2)((ulong)uVar10 >> 0x20);
  uStack_c0a = (undefined2)((ulong)uVar10 >> 0x30);
  uStack_c20 = (undefined2)uVar16;
  uStack_c1e = (undefined2)((ulong)uVar16 >> 0x10);
  uStack_c1c = (undefined2)((ulong)uVar16 >> 0x20);
  uStack_c1a = (undefined2)((ulong)uVar16 >> 0x30);
  auVar42._2_2_ = local_cc8;
  auVar42._0_2_ = local_cb8;
  auVar42._4_2_ = uStack_cb6;
  auVar42._6_2_ = uStack_cc6;
  auVar42._10_2_ = uStack_cc4;
  auVar42._8_2_ = uStack_cb4;
  auVar42._12_2_ = uStack_cb2;
  auVar42._14_2_ = uStack_cc2;
  auVar41._8_8_ = CONCAT44(iVar65,iVar65);
  auVar41._0_8_ = CONCAT44(iVar65,iVar65);
  auVar75 = pmaddwd(auVar42,auVar41);
  auVar40._2_2_ = uStack_c20;
  auVar40._0_2_ = uStack_c10;
  auVar40._4_2_ = uStack_c0e;
  auVar40._6_2_ = uStack_c1e;
  auVar40._10_2_ = uStack_c1c;
  auVar40._8_2_ = uStack_c0c;
  auVar40._12_2_ = uStack_c0a;
  auVar40._14_2_ = uStack_c1a;
  auVar39._8_8_ = CONCAT44(iVar65,iVar65);
  auVar39._0_8_ = CONCAT44(iVar65,iVar65);
  auVar76 = pmaddwd(auVar40,auVar39);
  auVar38._2_2_ = local_cc8;
  auVar38._0_2_ = local_cb8;
  auVar38._4_2_ = uStack_cb6;
  auVar38._6_2_ = uStack_cc6;
  auVar38._10_2_ = uStack_cc4;
  auVar38._8_2_ = uStack_cb4;
  auVar38._12_2_ = uStack_cb2;
  auVar38._14_2_ = uStack_cc2;
  auVar37._8_8_ = CONCAT44(uVar66,uVar66);
  auVar37._0_8_ = CONCAT44(uVar66,uVar66);
  auVar77 = pmaddwd(auVar38,auVar37);
  auVar36._2_2_ = uStack_c20;
  auVar36._0_2_ = uStack_c10;
  auVar36._4_2_ = uStack_c0e;
  auVar36._6_2_ = uStack_c1e;
  auVar36._10_2_ = uStack_c1c;
  auVar36._8_2_ = uStack_c0c;
  auVar36._12_2_ = uStack_c0a;
  auVar36._14_2_ = uStack_c1a;
  auVar35._8_8_ = CONCAT44(uVar66,uVar66);
  auVar35._0_8_ = CONCAT44(uVar66,uVar66);
  auVar78 = pmaddwd(auVar36,auVar35);
  local_718 = auVar75._0_4_;
  iStack_714 = auVar75._4_4_;
  iStack_710 = auVar75._8_4_;
  iStack_70c = auVar75._12_4_;
  local_738 = auVar76._0_4_;
  iStack_734 = auVar76._4_4_;
  iStack_730 = auVar76._8_4_;
  iStack_72c = auVar76._12_4_;
  local_758 = auVar77._0_4_;
  iStack_754 = auVar77._4_4_;
  iStack_750 = auVar77._8_4_;
  iStack_74c = auVar77._12_4_;
  local_778 = auVar78._0_4_;
  iStack_774 = auVar78._4_4_;
  iStack_770 = auVar78._8_4_;
  iStack_76c = auVar78._12_4_;
  auVar75 = ZEXT416(0xc);
  auVar76 = ZEXT416(0xc);
  auVar77 = ZEXT416(0xc);
  auVar78 = ZEXT416(0xc);
  auVar62._4_4_ = iStack_714 + 0x800 >> auVar75;
  auVar62._0_4_ = local_718 + 0x800 >> auVar75;
  auVar62._12_4_ = iStack_70c + 0x800 >> auVar75;
  auVar62._8_4_ = iStack_710 + 0x800 >> auVar75;
  auVar61._4_4_ = iStack_734 + 0x800 >> auVar76;
  auVar61._0_4_ = local_738 + 0x800 >> auVar76;
  auVar61._12_4_ = iStack_72c + 0x800 >> auVar76;
  auVar61._8_4_ = iStack_730 + 0x800 >> auVar76;
  auVar75 = packssdw(auVar62,auVar61);
  auVar60._4_4_ = iStack_754 + 0x800 >> auVar77;
  auVar60._0_4_ = local_758 + 0x800 >> auVar77;
  auVar60._12_4_ = iStack_74c + 0x800 >> auVar77;
  auVar60._8_4_ = iStack_750 + 0x800 >> auVar77;
  auVar59._4_4_ = iStack_774 + 0x800 >> auVar78;
  auVar59._0_4_ = local_778 + 0x800 >> auVar78;
  auVar59._12_4_ = iStack_76c + 0x800 >> auVar78;
  auVar59._8_4_ = iStack_770 + 0x800 >> auVar78;
  auVar76 = packssdw(auVar60,auVar59);
  local_cd8 = (undefined2)uVar11;
  uStack_cd6 = (undefined2)((ulong)uVar11 >> 0x10);
  uStack_cd4 = (undefined2)((ulong)uVar11 >> 0x20);
  uStack_cd2 = (undefined2)((ulong)uVar11 >> 0x30);
  local_ce8 = (undefined2)uVar13;
  uStack_ce6 = (undefined2)((ulong)uVar13 >> 0x10);
  uStack_ce4 = (undefined2)((ulong)uVar13 >> 0x20);
  uStack_ce2 = (undefined2)((ulong)uVar13 >> 0x30);
  uStack_c30 = (undefined2)uVar12;
  uStack_c2e = (undefined2)((ulong)uVar12 >> 0x10);
  uStack_c2c = (undefined2)((ulong)uVar12 >> 0x20);
  uStack_c2a = (undefined2)((ulong)uVar12 >> 0x30);
  uStack_c40 = (undefined2)uVar14;
  uStack_c3e = (undefined2)((ulong)uVar14 >> 0x10);
  uStack_c3c = (undefined2)((ulong)uVar14 >> 0x20);
  uStack_c3a = (undefined2)((ulong)uVar14 >> 0x30);
  auVar34._2_2_ = local_ce8;
  auVar34._0_2_ = local_cd8;
  auVar34._4_2_ = uStack_cd6;
  auVar34._6_2_ = uStack_ce6;
  auVar34._10_2_ = uStack_ce4;
  auVar34._8_2_ = uStack_cd4;
  auVar34._12_2_ = uStack_cd2;
  auVar34._14_2_ = uStack_ce2;
  auVar33._8_8_ = CONCAT44(iVar67,iVar67);
  auVar33._0_8_ = CONCAT44(iVar67,iVar67);
  auVar77 = pmaddwd(auVar34,auVar33);
  auVar32._2_2_ = uStack_c40;
  auVar32._0_2_ = uStack_c30;
  auVar32._4_2_ = uStack_c2e;
  auVar32._6_2_ = uStack_c3e;
  auVar32._10_2_ = uStack_c3c;
  auVar32._8_2_ = uStack_c2c;
  auVar32._12_2_ = uStack_c2a;
  auVar32._14_2_ = uStack_c3a;
  auVar31._8_8_ = CONCAT44(iVar67,iVar67);
  auVar31._0_8_ = CONCAT44(iVar67,iVar67);
  auVar78 = pmaddwd(auVar32,auVar31);
  auVar30._2_2_ = local_ce8;
  auVar30._0_2_ = local_cd8;
  auVar30._4_2_ = uStack_cd6;
  auVar30._6_2_ = uStack_ce6;
  auVar30._10_2_ = uStack_ce4;
  auVar30._8_2_ = uStack_cd4;
  auVar30._12_2_ = uStack_cd2;
  auVar30._14_2_ = uStack_ce2;
  auVar29._8_8_ = CONCAT44(uVar68,uVar68);
  auVar29._0_8_ = CONCAT44(uVar68,uVar68);
  auVar79 = pmaddwd(auVar30,auVar29);
  auVar28._2_2_ = uStack_c40;
  auVar28._0_2_ = uStack_c30;
  auVar28._4_2_ = uStack_c2e;
  auVar28._6_2_ = uStack_c3e;
  auVar28._10_2_ = uStack_c3c;
  auVar28._8_2_ = uStack_c2c;
  auVar28._12_2_ = uStack_c2a;
  auVar28._14_2_ = uStack_c3a;
  auVar27._8_8_ = CONCAT44(uVar68,uVar68);
  auVar27._0_8_ = CONCAT44(uVar68,uVar68);
  auVar80 = pmaddwd(auVar28,auVar27);
  local_798 = auVar77._0_4_;
  iStack_794 = auVar77._4_4_;
  iStack_790 = auVar77._8_4_;
  iStack_78c = auVar77._12_4_;
  local_7b8 = auVar78._0_4_;
  iStack_7b4 = auVar78._4_4_;
  iStack_7b0 = auVar78._8_4_;
  iStack_7ac = auVar78._12_4_;
  local_7d8 = auVar79._0_4_;
  iStack_7d4 = auVar79._4_4_;
  iStack_7d0 = auVar79._8_4_;
  iStack_7cc = auVar79._12_4_;
  local_7f8 = auVar80._0_4_;
  iStack_7f4 = auVar80._4_4_;
  iStack_7f0 = auVar80._8_4_;
  iStack_7ec = auVar80._12_4_;
  auVar77 = ZEXT416(0xc);
  auVar78 = ZEXT416(0xc);
  auVar79 = ZEXT416(0xc);
  auVar80 = ZEXT416(0xc);
  auVar58._4_4_ = iStack_794 + 0x800 >> auVar77;
  auVar58._0_4_ = local_798 + 0x800 >> auVar77;
  auVar58._12_4_ = iStack_78c + 0x800 >> auVar77;
  auVar58._8_4_ = iStack_790 + 0x800 >> auVar77;
  auVar57._4_4_ = iStack_7b4 + 0x800 >> auVar78;
  auVar57._0_4_ = local_7b8 + 0x800 >> auVar78;
  auVar57._12_4_ = iStack_7ac + 0x800 >> auVar78;
  auVar57._8_4_ = iStack_7b0 + 0x800 >> auVar78;
  auVar77 = packssdw(auVar58,auVar57);
  auVar56._4_4_ = iStack_7d4 + 0x800 >> auVar79;
  auVar56._0_4_ = local_7d8 + 0x800 >> auVar79;
  auVar56._12_4_ = iStack_7cc + 0x800 >> auVar79;
  auVar56._8_4_ = iStack_7d0 + 0x800 >> auVar79;
  auVar55._4_4_ = iStack_7f4 + 0x800 >> auVar80;
  auVar55._0_4_ = local_7f8 + 0x800 >> auVar80;
  auVar55._12_4_ = iStack_7ec + 0x800 >> auVar80;
  auVar55._8_4_ = iStack_7f0 + 0x800 >> auVar80;
  auVar78 = packssdw(auVar56,auVar55);
  local_cf8 = (undefined2)uVar1;
  uStack_cf6 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_cf4 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_cf2 = (undefined2)((ulong)uVar1 >> 0x30);
  local_d08 = (undefined2)uVar3;
  uStack_d06 = (undefined2)((ulong)uVar3 >> 0x10);
  uStack_d04 = (undefined2)((ulong)uVar3 >> 0x20);
  uStack_d02 = (undefined2)((ulong)uVar3 >> 0x30);
  uStack_c50 = (undefined2)uVar2;
  uStack_c4e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_c4c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_c4a = (undefined2)((ulong)uVar2 >> 0x30);
  uStack_c60 = (undefined2)uVar4;
  uStack_c5e = (undefined2)((ulong)uVar4 >> 0x10);
  uStack_c5c = (undefined2)((ulong)uVar4 >> 0x20);
  uStack_c5a = (undefined2)((ulong)uVar4 >> 0x30);
  auVar26._2_2_ = local_d08;
  auVar26._0_2_ = local_cf8;
  auVar26._4_2_ = uStack_cf6;
  auVar26._6_2_ = uStack_d06;
  auVar26._10_2_ = uStack_d04;
  auVar26._8_2_ = uStack_cf4;
  auVar26._12_2_ = uStack_cf2;
  auVar26._14_2_ = uStack_d02;
  auVar25._8_8_ = uVar64;
  auVar25._0_8_ = uVar63;
  auVar79 = pmaddwd(auVar26,auVar25);
  auVar24._2_2_ = uStack_c60;
  auVar24._0_2_ = uStack_c50;
  auVar24._4_2_ = uStack_c4e;
  auVar24._6_2_ = uStack_c5e;
  auVar24._10_2_ = uStack_c5c;
  auVar24._8_2_ = uStack_c4c;
  auVar24._12_2_ = uStack_c4a;
  auVar24._14_2_ = uStack_c5a;
  auVar23._8_8_ = uVar64;
  auVar23._0_8_ = uVar63;
  auVar80 = pmaddwd(auVar24,auVar23);
  auVar22._2_2_ = local_d08;
  auVar22._0_2_ = local_cf8;
  auVar22._4_2_ = uStack_cf6;
  auVar22._6_2_ = uStack_d06;
  auVar22._10_2_ = uStack_d04;
  auVar22._8_2_ = uStack_cf4;
  auVar22._12_2_ = uStack_cf2;
  auVar22._14_2_ = uStack_d02;
  auVar21._8_8_ = CONCAT44(iVar70,iVar70);
  auVar21._0_8_ = CONCAT44(iVar70,iVar70);
  auVar81 = pmaddwd(auVar22,auVar21);
  auVar20._2_2_ = uStack_c60;
  auVar20._0_2_ = uStack_c50;
  auVar20._4_2_ = uStack_c4e;
  auVar20._6_2_ = uStack_c5e;
  auVar20._10_2_ = uStack_c5c;
  auVar20._8_2_ = uStack_c4c;
  auVar20._12_2_ = uStack_c4a;
  auVar20._14_2_ = uStack_c5a;
  auVar19._8_8_ = CONCAT44(iVar70,iVar70);
  auVar19._0_8_ = CONCAT44(iVar70,iVar70);
  auVar82 = pmaddwd(auVar20,auVar19);
  local_818 = auVar79._0_4_;
  iStack_814 = auVar79._4_4_;
  iStack_810 = auVar79._8_4_;
  iStack_80c = auVar79._12_4_;
  local_838 = auVar80._0_4_;
  iStack_834 = auVar80._4_4_;
  iStack_830 = auVar80._8_4_;
  iStack_82c = auVar80._12_4_;
  local_858 = auVar81._0_4_;
  iStack_854 = auVar81._4_4_;
  iStack_850 = auVar81._8_4_;
  iStack_84c = auVar81._12_4_;
  local_878 = auVar82._0_4_;
  iStack_874 = auVar82._4_4_;
  iStack_870 = auVar82._8_4_;
  iStack_86c = auVar82._12_4_;
  auVar79 = ZEXT416(0xc);
  auVar80 = ZEXT416(0xc);
  auVar81 = ZEXT416(0xc);
  auVar82 = ZEXT416(0xc);
  auVar54._4_4_ = iStack_814 + 0x800 >> auVar79;
  auVar54._0_4_ = local_818 + 0x800 >> auVar79;
  auVar54._12_4_ = iStack_80c + 0x800 >> auVar79;
  auVar54._8_4_ = iStack_810 + 0x800 >> auVar79;
  auVar53._4_4_ = iStack_834 + 0x800 >> auVar80;
  auVar53._0_4_ = local_838 + 0x800 >> auVar80;
  auVar53._12_4_ = iStack_82c + 0x800 >> auVar80;
  auVar53._8_4_ = iStack_830 + 0x800 >> auVar80;
  auVar79 = packssdw(auVar54,auVar53);
  auVar52._4_4_ = iStack_854 + 0x800 >> auVar81;
  auVar52._0_4_ = local_858 + 0x800 >> auVar81;
  auVar52._12_4_ = iStack_84c + 0x800 >> auVar81;
  auVar52._8_4_ = iStack_850 + 0x800 >> auVar81;
  auVar51._4_4_ = iStack_874 + 0x800 >> auVar82;
  auVar51._0_4_ = local_878 + 0x800 >> auVar82;
  auVar51._12_4_ = iStack_86c + 0x800 >> auVar82;
  auVar51._8_4_ = iStack_870 + 0x800 >> auVar82;
  auVar80 = packssdw(auVar52,auVar51);
  local_d18 = (undefined2)uVar5;
  uStack_d16 = (undefined2)((ulong)uVar5 >> 0x10);
  uStack_d14 = (undefined2)((ulong)uVar5 >> 0x20);
  uStack_d12 = (undefined2)((ulong)uVar5 >> 0x30);
  local_d28 = (undefined2)uVar7;
  uStack_d26 = (undefined2)((ulong)uVar7 >> 0x10);
  uStack_d24 = (undefined2)((ulong)uVar7 >> 0x20);
  uStack_d22 = (undefined2)((ulong)uVar7 >> 0x30);
  uStack_c70 = (undefined2)uVar6;
  uStack_c6e = (undefined2)((ulong)uVar6 >> 0x10);
  uStack_c6c = (undefined2)((ulong)uVar6 >> 0x20);
  uStack_c6a = (undefined2)((ulong)uVar6 >> 0x30);
  uStack_c80 = (undefined2)uVar8;
  uStack_c7e = (undefined2)((ulong)uVar8 >> 0x10);
  uStack_c7c = (undefined2)((ulong)uVar8 >> 0x20);
  uStack_c7a = (undefined2)((ulong)uVar8 >> 0x30);
  auVar18._2_2_ = local_d28;
  auVar18._0_2_ = local_d18;
  auVar18._4_2_ = uStack_d16;
  auVar18._6_2_ = uStack_d26;
  auVar18._10_2_ = uStack_d24;
  auVar18._8_2_ = uStack_d14;
  auVar18._12_2_ = uStack_d12;
  auVar18._14_2_ = uStack_d22;
  auVar17._8_8_ = CONCAT44(iVar71,iVar71);
  auVar17._0_8_ = CONCAT44(iVar71,iVar71);
  auVar81 = pmaddwd(auVar18,auVar17);
  auVar87._2_2_ = uStack_c80;
  auVar87._0_2_ = uStack_c70;
  auVar87._4_2_ = uStack_c6e;
  auVar87._6_2_ = uStack_c7e;
  auVar87._10_2_ = uStack_c7c;
  auVar87._8_2_ = uStack_c6c;
  auVar87._12_2_ = uStack_c6a;
  auVar87._14_2_ = uStack_c7a;
  auVar86._8_8_ = CONCAT44(iVar71,iVar71);
  auVar86._0_8_ = CONCAT44(iVar71,iVar71);
  auVar82 = pmaddwd(auVar87,auVar86);
  auVar85._2_2_ = local_d28;
  auVar85._0_2_ = local_d18;
  auVar85._4_2_ = uStack_d16;
  auVar85._6_2_ = uStack_d26;
  auVar85._10_2_ = uStack_d24;
  auVar85._8_2_ = uStack_d14;
  auVar85._12_2_ = uStack_d12;
  auVar85._14_2_ = uStack_d22;
  auVar83._8_8_ = CONCAT44(uVar72,uVar72);
  auVar83._0_8_ = CONCAT44(uVar72,uVar72);
  auVar83 = pmaddwd(auVar85,auVar83);
  auVar88._2_2_ = uStack_c80;
  auVar88._0_2_ = uStack_c70;
  auVar88._4_2_ = uStack_c6e;
  auVar88._6_2_ = uStack_c7e;
  auVar88._10_2_ = uStack_c7c;
  auVar88._8_2_ = uStack_c6c;
  auVar88._12_2_ = uStack_c6a;
  auVar88._14_2_ = uStack_c7a;
  auVar84._8_8_ = CONCAT44(uVar72,uVar72);
  auVar84._0_8_ = CONCAT44(uVar72,uVar72);
  auVar84 = pmaddwd(auVar88,auVar84);
  local_898 = auVar81._0_4_;
  iStack_894 = auVar81._4_4_;
  iStack_890 = auVar81._8_4_;
  iStack_88c = auVar81._12_4_;
  local_8b8 = auVar82._0_4_;
  iStack_8b4 = auVar82._4_4_;
  iStack_8b0 = auVar82._8_4_;
  iStack_8ac = auVar82._12_4_;
  local_8d8 = auVar83._0_4_;
  iStack_8d4 = auVar83._4_4_;
  iStack_8d0 = auVar83._8_4_;
  iStack_8cc = auVar83._12_4_;
  local_8f8 = auVar84._0_4_;
  iStack_8f4 = auVar84._4_4_;
  iStack_8f0 = auVar84._8_4_;
  iStack_8ec = auVar84._12_4_;
  auVar81 = ZEXT416(0xc);
  auVar82 = ZEXT416(0xc);
  auVar84 = ZEXT416(0xc);
  auVar88 = ZEXT416(0xc);
  auVar50._4_4_ = iStack_894 + 0x800 >> auVar81;
  auVar50._0_4_ = local_898 + 0x800 >> auVar81;
  auVar50._12_4_ = iStack_88c + 0x800 >> auVar81;
  auVar50._8_4_ = iStack_890 + 0x800 >> auVar81;
  auVar49._4_4_ = iStack_8b4 + 0x800 >> auVar82;
  auVar49._0_4_ = local_8b8 + 0x800 >> auVar82;
  auVar49._12_4_ = iStack_8ac + 0x800 >> auVar82;
  auVar49._8_4_ = iStack_8b0 + 0x800 >> auVar82;
  auVar81 = packssdw(auVar50,auVar49);
  auVar48._4_4_ = iStack_8d4 + 0x800 >> auVar84;
  auVar48._0_4_ = local_8d8 + 0x800 >> auVar84;
  auVar48._12_4_ = iStack_8cc + 0x800 >> auVar84;
  auVar48._8_4_ = iStack_8d0 + 0x800 >> auVar84;
  auVar47._4_4_ = iStack_8f4 + 0x800 >> auVar88;
  auVar47._0_4_ = local_8f8 + 0x800 >> auVar88;
  auVar47._12_4_ = iStack_8ec + 0x800 >> auVar88;
  auVar47._8_4_ = iStack_8f0 + 0x800 >> auVar88;
  auVar82 = packssdw(auVar48,auVar47);
  auVar84 = paddsw(auVar75,auVar77);
  auVar75 = psubsw(auVar75,auVar77);
  auVar77 = psubsw(auVar76,auVar78);
  auVar88 = paddsw(auVar76,auVar78);
  auVar83 = paddsw(auVar79,auVar82);
  auVar85 = psubsw(auVar79,auVar82);
  auVar86 = paddsw(auVar80,auVar81);
  auVar87 = psubsw(auVar80,auVar81);
  local_d38 = auVar75._0_2_;
  uStack_d36 = auVar75._2_2_;
  uStack_d34 = auVar75._4_2_;
  uStack_d32 = auVar75._6_2_;
  local_d48 = auVar77._0_2_;
  uStack_d46 = auVar77._2_2_;
  uStack_d44 = auVar77._4_2_;
  uStack_d42 = auVar77._6_2_;
  uStack_c90 = auVar75._8_2_;
  uStack_c8e = auVar75._10_2_;
  uStack_c8c = auVar75._12_2_;
  uStack_c8a = auVar75._14_2_;
  uStack_ca0 = auVar77._8_2_;
  uStack_c9e = auVar77._10_2_;
  uStack_c9c = auVar77._12_2_;
  uStack_c9a = auVar77._14_2_;
  auVar82._2_2_ = local_d48;
  auVar82._0_2_ = local_d38;
  auVar82._4_2_ = uStack_d36;
  auVar82._6_2_ = uStack_d46;
  auVar82._10_2_ = uStack_d44;
  auVar82._8_2_ = uStack_d34;
  auVar82._12_2_ = uStack_d32;
  auVar82._14_2_ = uStack_d42;
  auVar81._8_8_ = CONCAT44(uVar73,uVar73);
  auVar81._0_8_ = CONCAT44(uVar73,uVar73);
  auVar81 = pmaddwd(auVar82,auVar81);
  auVar80._2_2_ = uStack_ca0;
  auVar80._0_2_ = uStack_c90;
  auVar80._4_2_ = uStack_c8e;
  auVar80._6_2_ = uStack_c9e;
  auVar80._10_2_ = uStack_c9c;
  auVar80._8_2_ = uStack_c8c;
  auVar80._12_2_ = uStack_c8a;
  auVar80._14_2_ = uStack_c9a;
  auVar79._8_8_ = CONCAT44(uVar73,uVar73);
  auVar79._0_8_ = CONCAT44(uVar73,uVar73);
  auVar79 = pmaddwd(auVar80,auVar79);
  auVar78._2_2_ = local_d48;
  auVar78._0_2_ = local_d38;
  auVar78._4_2_ = uStack_d36;
  auVar78._6_2_ = uStack_d46;
  auVar78._10_2_ = uStack_d44;
  auVar78._8_2_ = uStack_d34;
  auVar78._12_2_ = uStack_d32;
  auVar78._14_2_ = uStack_d42;
  auVar77._8_8_ = uVar64;
  auVar77._0_8_ = uVar63;
  auVar77 = pmaddwd(auVar78,auVar77);
  auVar76._2_2_ = uStack_ca0;
  auVar76._0_2_ = uStack_c90;
  auVar76._4_2_ = uStack_c8e;
  auVar76._6_2_ = uStack_c9e;
  auVar76._10_2_ = uStack_c9c;
  auVar76._8_2_ = uStack_c8c;
  auVar76._12_2_ = uStack_c8a;
  auVar76._14_2_ = uStack_c9a;
  auVar75._8_8_ = uVar64;
  auVar75._0_8_ = uVar63;
  auVar75 = pmaddwd(auVar76,auVar75);
  local_918 = auVar81._0_4_;
  iStack_914 = auVar81._4_4_;
  iStack_910 = auVar81._8_4_;
  iStack_90c = auVar81._12_4_;
  local_938 = auVar79._0_4_;
  iStack_934 = auVar79._4_4_;
  iStack_930 = auVar79._8_4_;
  iStack_92c = auVar79._12_4_;
  local_958 = auVar77._0_4_;
  iStack_954 = auVar77._4_4_;
  iStack_950 = auVar77._8_4_;
  iStack_94c = auVar77._12_4_;
  local_978 = auVar75._0_4_;
  iStack_974 = auVar75._4_4_;
  iStack_970 = auVar75._8_4_;
  iStack_96c = auVar75._12_4_;
  auVar75 = ZEXT416(0xc);
  auVar76 = ZEXT416(0xc);
  auVar77 = ZEXT416(0xc);
  auVar78 = ZEXT416(0xc);
  auVar46._4_4_ = iStack_914 + 0x800 >> auVar75;
  auVar46._0_4_ = local_918 + 0x800 >> auVar75;
  auVar46._12_4_ = iStack_90c + 0x800 >> auVar75;
  auVar46._8_4_ = iStack_910 + 0x800 >> auVar75;
  auVar45._4_4_ = iStack_934 + 0x800 >> auVar76;
  auVar45._0_4_ = local_938 + 0x800 >> auVar76;
  auVar45._12_4_ = iStack_92c + 0x800 >> auVar76;
  auVar45._8_4_ = iStack_930 + 0x800 >> auVar76;
  auVar75 = packssdw(auVar46,auVar45);
  auVar44._4_4_ = iStack_954 + 0x800 >> auVar77;
  auVar44._0_4_ = local_958 + 0x800 >> auVar77;
  auVar44._12_4_ = iStack_94c + 0x800 >> auVar77;
  auVar44._8_4_ = iStack_950 + 0x800 >> auVar77;
  auVar43._4_4_ = iStack_974 + 0x800 >> auVar78;
  auVar43._0_4_ = local_978 + 0x800 >> auVar78;
  auVar43._12_4_ = iStack_96c + 0x800 >> auVar78;
  auVar43._8_4_ = iStack_970 + 0x800 >> auVar78;
  auVar76 = packssdw(auVar44,auVar43);
  auVar77 = paddsw(auVar83,auVar88);
  *in_RSI = auVar77;
  auVar77 = psubsw(auVar83,auVar88);
  in_RSI[7] = auVar77;
  auVar77 = paddsw(auVar86,auVar76);
  in_RSI[1] = auVar77;
  auVar76 = psubsw(auVar86,auVar76);
  in_RSI[6] = auVar76;
  auVar76 = paddsw(auVar87,auVar75);
  in_RSI[2] = auVar76;
  auVar75 = psubsw(auVar87,auVar75);
  in_RSI[5] = auVar75;
  auVar75 = paddsw(auVar85,auVar84);
  in_RSI[3] = auVar75;
  auVar75 = psubsw(auVar85,auVar84);
  in_RSI[4] = auVar75;
  return;
}

Assistant:

void av1_idct8_sse2(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m128i cospi_p56_m08 = pair_set_epi16(cospi[56], -cospi[8]);
  const __m128i cospi_p08_p56 = pair_set_epi16(cospi[8], cospi[56]);
  const __m128i cospi_p24_m40 = pair_set_epi16(cospi[24], -cospi[40]);
  const __m128i cospi_p40_p24 = pair_set_epi16(cospi[40], cospi[24]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);
  const __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);
  const __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);
  const __m128i cospi_m32_p32 = pair_set_epi16(-cospi[32], cospi[32]);

  // stage 1
  __m128i x[8];
  x[0] = input[0];
  x[1] = input[4];
  x[2] = input[2];
  x[3] = input[6];
  x[4] = input[1];
  x[5] = input[5];
  x[6] = input[3];
  x[7] = input[7];

  // stage 2
  btf_16_sse2(cospi_p56_m08, cospi_p08_p56, x[4], x[7], x[4], x[7]);
  btf_16_sse2(cospi_p24_m40, cospi_p40_p24, x[5], x[6], x[5], x[6]);

  // stage 3
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x[0], x[1], x[0], x[1]);
  btf_16_sse2(cospi_p48_m16, cospi_p16_p48, x[2], x[3], x[2], x[3]);
  btf_16_adds_subs_sse2(x[4], x[5]);
  btf_16_subs_adds_sse2(x[7], x[6]);

  // stage 4
  btf_16_adds_subs_sse2(x[0], x[3]);
  btf_16_adds_subs_sse2(x[1], x[2]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[5], x[6], x[5], x[6]);

  // stage 5
  btf_16_adds_subs_out_sse2(output[0], output[7], x[0], x[7]);
  btf_16_adds_subs_out_sse2(output[1], output[6], x[1], x[6]);
  btf_16_adds_subs_out_sse2(output[2], output[5], x[2], x[5]);
  btf_16_adds_subs_out_sse2(output[3], output[4], x[3], x[4]);
}